

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O2

uint __thiscall
ON_UuidPtrList2::GetUuids(ON_UuidPtrList2 *this,ON_SimpleArray<ON_UUID_struct> *uuid_list)

{
  uint uVar1;
  __node_base _Var2;
  
  ON_SimpleArray<ON_UUID_struct>::Reserve
            (uuid_list,
             (ulong)*(uint *)((long)&((this->m_private)._M_t.
                                      super___uniq_ptr_impl<ON_UuidPtrList2_Private,_std::default_delete<ON_UuidPtrList2_Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_ON_UuidPtrList2_Private_*,_std::default_delete<ON_UuidPtrList2_Private>_>
                                      .super__Head_base<0UL,_ON_UuidPtrList2_Private_*,_false>.
                                     _M_head_impl)->super_ON_UuidList2_Private<unsigned_long> + 0x18
                             ));
  _Var2._M_nxt = (_Hash_node_base *)
                 ((long)&((this->m_private)._M_t.
                          super___uniq_ptr_impl<ON_UuidPtrList2_Private,_std::default_delete<ON_UuidPtrList2_Private>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ON_UuidPtrList2_Private_*,_std::default_delete<ON_UuidPtrList2_Private>_>
                          .super__Head_base<0UL,_ON_UuidPtrList2_Private_*,_false>._M_head_impl)->
                         super_ON_UuidList2_Private<unsigned_long> + 0x10);
  uVar1 = 0;
  while (_Var2._M_nxt = (_Var2._M_nxt)->_M_nxt, _Var2._M_nxt != (_Hash_node_base *)0x0) {
    ON_SimpleArray<ON_UUID_struct>::Append(uuid_list,(ON_UUID_struct *)(_Var2._M_nxt + 1));
    uVar1 = uVar1 + 1;
  }
  return uVar1;
}

Assistant:

unsigned int ON_UuidPtrList2::GetUuids(ON_SimpleArray<ON_UUID>& uuid_list) const
{
  uuid_list.Reserve(Count());

  int i = 0;
  for (const auto& pair : m_private->map)
  {
    uuid_list.Append(pair.first);
    i++;
  }
  return i;
}